

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_bcast.cpp
# Opt level: O2

void Omega_h::bcast_mesh(Mesh *mesh,CommPtr *new_comm,bool is_source)

{
  I32 IVar1;
  TagBase *this;
  mapped_type *this_00;
  _Base_ptr p_Var2;
  int iVar3;
  ulong uVar4;
  Mesh *pMVar5;
  I32 j;
  long lVar6;
  allocator local_135;
  I32 ncomps;
  Mesh *local_130;
  ulong local_128;
  I32 tag_type;
  I32 dim;
  ClassPair pair;
  Adj down;
  I32 nsets;
  I32 parting;
  I32 family;
  Write<double> local_b0;
  Write<long> local_a0;
  Write<int> local_90;
  Write<signed_char> local_80;
  Write<int> local_70;
  Adj local_60;
  
  IVar1 = Comm::rank((new_comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
  if (IVar1 == 0 && !is_source) {
    fail("assertion %s failed at %s +%d\n","is_source",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_bcast.cpp"
         ,9);
  }
  local_130 = mesh;
  if (is_source) {
    family = mesh->family_;
    Comm::bcast<int>((new_comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,&family,0);
    dim = Mesh::dim(mesh);
    Comm::bcast<int>((new_comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,&dim,0);
    parting = Mesh::parting(mesh);
    Comm::bcast<int>((new_comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,&parting,0);
  }
  else {
    Comm::bcast<int>((new_comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,&family,0);
    Mesh::set_family(mesh,family);
    Comm::bcast<int>((new_comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,&dim,0);
    Mesh::set_dim(mesh,dim);
    Comm::bcast<int>((new_comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,&parting,0);
    Mesh::set_parting(mesh,parting,false);
    Mesh::set_verts(mesh,0);
  }
  uVar4 = 0;
  do {
    pMVar5 = local_130;
    iVar3 = (int)uVar4;
    if (dim < iVar3) {
      if (is_source) {
        nsets = (I32)(local_130->class_sets)._M_t._M_impl.super__Rb_tree_header._M_node_count;
        Comm::bcast<int>((new_comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr,&nsets,0);
        p_Var2 = (pMVar5->class_sets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      else {
        p_Var2 = (_Base_ptr)0x0;
        Comm::bcast<int>((new_comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr,&nsets,0);
        pMVar5 = local_130;
      }
      for (uVar4 = 0; (int)uVar4 < nsets; uVar4 = (ulong)((int)uVar4 + 1)) {
        down.super_Graph.a2ab.write_.shared_alloc_.alloc = (Alloc *)&down.super_Graph.ab2b;
        down.super_Graph.a2ab.write_.shared_alloc_.direct_ptr = (void *)0x0;
        down.super_Graph.ab2b.write_.shared_alloc_.alloc._0_1_ = 0;
        if (is_source) {
          std::__cxx11::string::_M_assign((string *)&down);
        }
        Comm::bcast_string((new_comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)
                           ._M_ptr,(string *)&down,0);
        if (is_source) {
          ncomps = (I32)((ulong)((long)p_Var2[2]._M_parent - *(long *)(p_Var2 + 2)) >> 3);
        }
        local_128 = uVar4;
        Comm::bcast<int>((new_comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr,&ncomps,0);
        for (lVar6 = 0; lVar6 < ncomps; lVar6 = lVar6 + 1) {
          if (is_source) {
            pair = *(ClassPair *)(*(long *)(p_Var2 + 2) + lVar6 * 8);
          }
          Comm::bcast<int>((new_comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)
                           ._M_ptr,&pair.dim,0);
          Comm::bcast<int>((new_comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)
                           ._M_ptr,&pair.id,0);
          if (!is_source) {
            this_00 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
                      ::operator[](&pMVar5->class_sets,(key_type *)&down);
            std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::push_back
                      (this_00,&pair);
          }
        }
        if (is_source) {
          p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
        }
        uVar4 = local_128;
        std::__cxx11::string::~string((string *)&down);
      }
      return;
    }
    if (iVar3 != 0 && !is_source) {
      std::__cxx11::string::string((string *)&pair,"",(allocator *)&nsets);
      Read<int>::Read((Read<int> *)&local_70,(initializer_list<int>)ZEXT816(0),(string *)&pair);
      Adj::Adj(&down,(LOs *)&local_70);
      Write<int>::~Write(&local_70);
      std::__cxx11::string::~string((string *)&pair);
      if (iVar3 != 1) {
        std::__cxx11::string::string((string *)&pair,"",(allocator *)&ncomps);
        Read<signed_char>::Read
                  ((Read<signed_char> *)&nsets,(initializer_list<signed_char>)ZEXT816(0),
                   (string *)&pair);
        Write<signed_char>::operator=(&down.codes.write_,(Write<signed_char> *)&nsets);
        Write<signed_char>::~Write((Write<signed_char> *)&nsets);
        std::__cxx11::string::~string((string *)&pair);
      }
      Adj::Adj(&local_60,&down);
      Mesh::set_ents(local_130,iVar3,&local_60);
      Adj::~Adj(&local_60);
      Adj::~Adj(&down);
    }
    if (is_source) {
      nsets = Mesh::ntags(local_130,iVar3);
    }
    local_128 = uVar4;
    Comm::bcast<int>((new_comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,&nsets,0);
    for (iVar3 = 0; iVar3 < nsets; iVar3 = iVar3 + 1) {
      if (is_source) {
        this = Mesh::get_tag(local_130,(Int)local_128,iVar3);
        down.super_Graph.a2ab.write_.shared_alloc_.alloc = (Alloc *)&down.super_Graph.ab2b;
        down.super_Graph.a2ab.write_.shared_alloc_.direct_ptr = (void *)0x0;
        down.super_Graph.ab2b.write_.shared_alloc_.alloc._0_1_ = 0;
        TagBase::name_abi_cxx11_(this);
        std::__cxx11::string::_M_assign((string *)&down);
      }
      else {
        down.super_Graph.a2ab.write_.shared_alloc_.alloc = (Alloc *)&down.super_Graph.ab2b;
        down.super_Graph.a2ab.write_.shared_alloc_.direct_ptr = (void *)0x0;
        down.super_Graph.ab2b.write_.shared_alloc_.alloc._0_1_ = 0;
        this = (TagBase *)0x0;
      }
      Comm::bcast_string((new_comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr,(string *)&down,0);
      if (is_source) {
        ncomps = TagBase::ncomps(this);
      }
      Comm::bcast<int>((new_comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr,&ncomps,0);
      if (is_source) {
        tag_type = (*this->_vptr_TagBase[2])(this);
      }
      Comm::bcast<int>((new_comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr,&tag_type,0);
      IVar1 = ncomps;
      if (!is_source) {
        switch(tag_type) {
        case 0:
          std::__cxx11::string::string((string *)&pair,"",&local_135);
          Read<signed_char>::Read
                    ((Read<signed_char> *)&local_80,(initializer_list<signed_char>)ZEXT816(0),
                     (string *)&pair);
          Mesh::add_tag<signed_char>
                    (local_130,(Int)local_128,(string *)&down,IVar1,(Read<signed_char> *)&local_80,
                     false);
          Write<signed_char>::~Write(&local_80);
          break;
        default:
          goto switchD_0023bda6_caseD_1;
        case 2:
          std::__cxx11::string::string((string *)&pair,"",&local_135);
          Read<int>::Read((Read<int> *)&local_90,(initializer_list<int>)ZEXT816(0),(string *)&pair);
          Mesh::add_tag<int>(local_130,(Int)local_128,(string *)&down,IVar1,(Read<int> *)&local_90,
                             false);
          Write<int>::~Write(&local_90);
          break;
        case 3:
          std::__cxx11::string::string((string *)&pair,"",&local_135);
          Read<long>::Read((Read<long> *)&local_a0,(initializer_list<long>)ZEXT816(0),
                           (string *)&pair);
          Mesh::add_tag<long>(local_130,(Int)local_128,(string *)&down,IVar1,(Read<long> *)&local_a0
                              ,false);
          Write<long>::~Write(&local_a0);
          break;
        case 5:
          std::__cxx11::string::string((string *)&pair,"",&local_135);
          Read<double>::Read((Read<double> *)&local_b0,(initializer_list<double>)ZEXT816(0),
                             (string *)&pair);
          Mesh::add_tag<double>
                    (local_130,(Int)local_128,(string *)&down,IVar1,(Read<double> *)&local_b0,false)
          ;
          Write<double>::~Write(&local_b0);
        }
        std::__cxx11::string::~string((string *)&pair);
      }
switchD_0023bda6_caseD_1:
      std::__cxx11::string::~string((string *)&down);
    }
    uVar4 = (ulong)((Int)local_128 + 1);
  } while( true );
}

Assistant:

void bcast_mesh(Mesh* mesh, CommPtr new_comm, bool is_source) {
  if (new_comm->rank() == 0) {
    OMEGA_H_CHECK(is_source);
  }
  I32 family;
  if (is_source) family = mesh->family();
  new_comm->bcast(family);
  if (!is_source) mesh->set_family(Omega_h_Family(family));
  I32 dim;
  if (is_source) dim = mesh->dim();
  new_comm->bcast(dim);
  if (!is_source) mesh->set_dim(dim);
  I32 parting;
  if (is_source) parting = mesh->parting();
  new_comm->bcast(parting);
  if (!is_source) mesh->set_parting(Omega_h_Parting(parting));
  if (!is_source) mesh->set_verts(0);
  for (Int d = 0; d <= dim; ++d) {
    if (d > VERT && !is_source) {
      Adj down(LOs({}));
      if (d - 1 != VERT) down.codes = Read<I8>({});
      mesh->set_ents(d, down);
    }
    I32 ntags;
    if (is_source) ntags = mesh->ntags(d);
    new_comm->bcast(ntags);
    for (Int i = 0; i < ntags; ++i) {
      TagBase const* tag = nullptr;
      if (is_source) tag = mesh->get_tag(d, i);
      std::string name;
      if (is_source) name = tag->name();
      new_comm->bcast_string(name);
      I32 ncomps;
      if (is_source) ncomps = tag->ncomps();
      new_comm->bcast(ncomps);
      I32 tag_type;
      if (is_source) tag_type = tag->type();
      new_comm->bcast(tag_type);
      if (!is_source) {
        switch (tag_type) {
          case OMEGA_H_I8:
            mesh->add_tag(d, name, ncomps, Read<I8>({}));
            break;
          case OMEGA_H_I32:
            mesh->add_tag(d, name, ncomps, Read<I32>({}));
            break;
          case OMEGA_H_I64:
            mesh->add_tag(d, name, ncomps, Read<I64>({}));
            break;
          case OMEGA_H_F64:
            mesh->add_tag(d, name, ncomps, Read<Real>({}));
            break;
        }
      }
    }
  }
  I32 nsets;
  if (is_source) nsets = I32(mesh->class_sets.size());
  new_comm->bcast(nsets);
  decltype(mesh->class_sets)::iterator it;
  if (is_source) it = mesh->class_sets.begin();
  for (I32 i = 0; i < nsets; ++i) {
    std::string name;
    if (is_source) name = it->first;
    new_comm->bcast_string(name);
    I32 npairs;
    if (is_source) npairs = I32(it->second.size());
    new_comm->bcast(npairs);
    for (I32 j = 0; j < npairs; ++j) {
      ClassPair pair;
      if (is_source) pair = it->second[std::size_t(j)];
      new_comm->bcast(pair.dim);
      new_comm->bcast(pair.id);
      if (!is_source) mesh->class_sets[name].push_back(pair);
    }
    if (is_source) ++it;
  }
}